

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall glslang::TParseContext::finish(TParseContext *this)

{
  bool bVar1;
  uint uVar2;
  TLayoutGeometry TVar3;
  int iVar4;
  size_type sVar5;
  reference ppTVar6;
  TSourceLoc *pTVar7;
  ulong local_18;
  size_t i;
  TParseContext *this_local;
  
  TParseContextBase::finish(&this->super_TParseContextBase);
  if (((this->super_TParseContextBase).parsingBuiltins & 1U) == 0) {
    for (local_18 = 0;
        sVar5 = std::
                vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>::
                size(&(this->needsIndexLimitationChecking).
                      super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                    ), local_18 < sVar5; local_18 = local_18 + 1) {
      ppTVar6 = std::
                vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>::
                operator[](&(this->needsIndexLimitationChecking).
                            super_vector<glslang::TIntermTyped_*,_glslang::pool_allocator<glslang::TIntermTyped_*>_>
                           ,local_18);
      constantIndexExpressionCheck(this,&(*ppTVar6)->super_TIntermNode);
    }
    switch((this->super_TParseContextBase).super_TParseVersions.language) {
    case EShLangTessControl:
    case EShLangTessEvaluation:
      bVar1 = TParseVersions::isEsProfile((TParseVersions *)this);
      if ((bVar1) && ((this->super_TParseContextBase).super_TParseVersions.version == 0x136)) {
        pTVar7 = TParseVersions::getCurrentLoc((TParseVersions *)this);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,pTVar7,2,AEP_tessellation_shader,"tessellation shaders");
      }
      else {
        bVar1 = TParseVersions::isEsProfile((TParseVersions *)this);
        if ((!bVar1) && ((this->super_TParseContextBase).super_TParseVersions.version < 400)) {
          pTVar7 = TParseVersions::getCurrentLoc((TParseVersions *)this);
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                    (this,pTVar7,1,&E_GL_ARB_tessellation_shader,"tessellation shaders");
        }
      }
      break;
    case EShLangGeometry:
      bVar1 = TParseVersions::isEsProfile((TParseVersions *)this);
      if ((bVar1) && ((this->super_TParseContextBase).super_TParseVersions.version == 0x136)) {
        pTVar7 = TParseVersions::getCurrentLoc((TParseVersions *)this);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,pTVar7,2,AEP_geometry_shader,"geometry shaders");
      }
      break;
    default:
      break;
    case EShLangCompute:
      bVar1 = TParseVersions::isEsProfile((TParseVersions *)this);
      if ((!bVar1) && ((this->super_TParseContextBase).super_TParseVersions.version < 0x1ae)) {
        pTVar7 = TParseVersions::getCurrentLoc((TParseVersions *)this);
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                  (this,pTVar7,1,&E_GL_ARB_compute_shader,"compute shaders");
      }
      break;
    case EShLangTask:
      pTVar7 = TParseVersions::getCurrentLoc((TParseVersions *)this);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,pTVar7,2,AEP_mesh_shader,"task shaders");
      break;
    case EShLangMesh:
      pTVar7 = TParseVersions::getCurrentLoc((TParseVersions *)this);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[5])
                (this,pTVar7,2,AEP_mesh_shader,"mesh shaders");
    }
    if (((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) &&
       (uVar2 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                          (this,"GL_NV_geometry_shader_passthrough"), (uVar2 & 1) != 0)) {
      TVar3 = TIntermediate::getOutputPrimitive
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate);
      if (TVar3 == ElgNone) {
        TVar3 = TIntermediate::getInputPrimitive
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate);
        if (TVar3 == ElgPoints) {
          TIntermediate::setOutputPrimitive
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate,ElgPoints);
        }
        else if (TVar3 == ElgLines) {
          TIntermediate::setOutputPrimitive
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate,ElgLineStrip)
          ;
        }
        else if (TVar3 == ElgTriangles) {
          TIntermediate::setOutputPrimitive
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                     ElgTriangleStrip);
        }
      }
      iVar4 = TIntermediate::getVertices
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate);
      if (iVar4 == -1) {
        TVar3 = TIntermediate::getInputPrimitive
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate);
        if (TVar3 == ElgPoints) {
          TIntermediate::setVertices
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate,1);
        }
        else if (TVar3 == ElgLines) {
          TIntermediate::setVertices
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate,2);
        }
        else if (TVar3 == ElgTriangles) {
          TIntermediate::setVertices
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate,3);
        }
      }
    }
  }
  return;
}

Assistant:

void TParseContext::finish()
{
    TParseContextBase::finish();

    if (parsingBuiltins)
        return;

    // Check on array indexes for ES 2.0 (version 100) limitations.
    for (size_t i = 0; i < needsIndexLimitationChecking.size(); ++i)
        constantIndexExpressionCheck(needsIndexLimitationChecking[i]);

    // Check for stages that are enabled by extension.
    // Can't do this at the beginning, it is chicken and egg to add a stage by
    // extension.
    // Stage-specific features were correctly tested for already, this is just
    // about the stage itself.
    switch (language) {
    case EShLangGeometry:
        if (isEsProfile() && version == 310)
            requireExtensions(getCurrentLoc(), Num_AEP_geometry_shader, AEP_geometry_shader, "geometry shaders");
        break;
    case EShLangTessControl:
    case EShLangTessEvaluation:
        if (isEsProfile() && version == 310)
            requireExtensions(getCurrentLoc(), Num_AEP_tessellation_shader, AEP_tessellation_shader, "tessellation shaders");
        else if (!isEsProfile() && version < 400)
            requireExtensions(getCurrentLoc(), 1, &E_GL_ARB_tessellation_shader, "tessellation shaders");
        break;
    case EShLangCompute:
        if (!isEsProfile() && version < 430)
            requireExtensions(getCurrentLoc(), 1, &E_GL_ARB_compute_shader, "compute shaders");
        break;
    case EShLangTask:
        requireExtensions(getCurrentLoc(), Num_AEP_mesh_shader, AEP_mesh_shader, "task shaders");
        break;
    case EShLangMesh:
        requireExtensions(getCurrentLoc(), Num_AEP_mesh_shader, AEP_mesh_shader, "mesh shaders");
        break;
    default:
        break;
    }

    // Set default outputs for GL_NV_geometry_shader_passthrough
    if (language == EShLangGeometry && extensionTurnedOn(E_SPV_NV_geometry_shader_passthrough)) {
        if (intermediate.getOutputPrimitive() == ElgNone) {
            switch (intermediate.getInputPrimitive()) {
            case ElgPoints:      intermediate.setOutputPrimitive(ElgPoints);    break;
            case ElgLines:       intermediate.setOutputPrimitive(ElgLineStrip); break;
            case ElgTriangles:   intermediate.setOutputPrimitive(ElgTriangleStrip); break;
            default: break;
            }
        }
        if (intermediate.getVertices() == TQualifier::layoutNotSet) {
            switch (intermediate.getInputPrimitive()) {
            case ElgPoints:      intermediate.setVertices(1); break;
            case ElgLines:       intermediate.setVertices(2); break;
            case ElgTriangles:   intermediate.setVertices(3); break;
            default: break;
            }
        }
    }
}